

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

void Intp_ManUnsatCore_rec
               (Vec_Ptr_t *vAntClas,int iThis,Vec_Int_t *vCore,int nRoots,Vec_Str_t *vVisited,
               int fLearned)

{
  int iThis_00;
  Vec_Int_t *p;
  int i;
  
  if ((iThis < 0) || (vVisited->nSize <= iThis)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (vVisited->pArray[(uint)iThis] == '\0') {
    vVisited->pArray[(uint)iThis] = '\x01';
    if (iThis < nRoots) {
      if (fLearned == 0) {
LAB_0071da0e:
        Vec_IntPush(vCore,iThis);
        return;
      }
    }
    else {
      p = (Vec_Int_t *)Vec_PtrEntry(vAntClas,iThis - nRoots);
      for (i = 0; i < p->nSize; i = i + 1) {
        iThis_00 = Vec_IntEntry(p,i);
        Intp_ManUnsatCore_rec(vAntClas,iThis_00,vCore,nRoots,vVisited,fLearned);
      }
      if (fLearned != 0) goto LAB_0071da0e;
    }
  }
  return;
}

Assistant:

void Intp_ManUnsatCore_rec( Vec_Ptr_t * vAntClas, int iThis, Vec_Int_t * vCore, int nRoots, Vec_Str_t * vVisited, int fLearned )
{
//    int i, iStop, iStart;
    Vec_Int_t * vAnt;
    int i, Entry;
    // skip visited clauses
    if ( Vec_StrEntry( vVisited, iThis ) )
        return;
    Vec_StrWriteEntry( vVisited, iThis, 1 );
    // add a root clause to the core
    if ( iThis < nRoots )
    {
        if ( !fLearned )
            Vec_IntPush( vCore, iThis );
        return; 
    }
    // iterate through the clauses
//    iStart = Vec_IntEntry( vBreaks, iThis );
//    iStop = Vec_IntEntry( vBreaks, iThis+1 );
//    assert( iStop != -1 );
//    for ( i = iStart; i < iStop; i++ )
    vAnt = (Vec_Int_t *)Vec_PtrEntry( vAntClas, iThis - nRoots );
    Vec_IntForEachEntry( vAnt, Entry, i )
//        Intp_ManUnsatCore_rec( vAntClas, Vec_IntEntry(vAnties, i), vCore, nRoots, vVisited );
        Intp_ManUnsatCore_rec( vAntClas, Entry, vCore, nRoots, vVisited, fLearned );
    // collect learned clause
    if ( fLearned )
        Vec_IntPush( vCore, iThis );
}